

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * direct_alloc(size_t nb)

{
  int iVar1;
  ulong __len;
  int *piVar2;
  void *pvVar3;
  long lVar4;
  ulong *puVar5;
  ulong in_RDI;
  mchunkptr p;
  size_t psize;
  size_t offset;
  char *mm;
  size_t mmsize;
  void *ptr;
  int olderr;
  ulong local_60;
  
  __len = in_RDI + 0x1036 & 0xfffffffffffff000;
  if (in_RDI < __len) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    pvVar3 = mmap64((void *)0x0,__len,3,0x62,-1,0);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    if (pvVar3 != (void *)0xffffffffffffffff) {
      if (((long)pvVar3 + 0x10U & 7) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = 8 - ((long)pvVar3 + 0x10U & 7) & 7;
      }
      lVar4 = __len - local_60;
      puVar5 = (ulong *)((long)pvVar3 + local_60);
      *puVar5 = local_60 | 1;
      puVar5[1] = lVar4 - 0x20U | 2;
      *(undefined8 *)((long)puVar5 + lVar4 + -0x18) = 0xb;
      *(undefined8 *)((long)puVar5 + lVar4 + -0x10) = 0;
      return puVar5 + 2;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *direct_alloc(size_t nb)
{
  size_t mmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  if (LJ_LIKELY(mmsize > nb)) {     /* Check for wrap around 0 */
    char *mm = (char *)(DIRECT_MMAP(mmsize));
    if (mm != CMFAIL) {
      size_t offset = align_offset(chunk2mem(mm));
      size_t psize = mmsize - offset - DIRECT_FOOT_PAD;
      mchunkptr p = (mchunkptr)(mm + offset);
      p->prev_foot = offset | IS_DIRECT_BIT;
      p->head = psize|CINUSE_BIT;
      chunk_plus_offset(p, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(p, psize+SIZE_T_SIZE)->head = 0;
      return chunk2mem(p);
    }
  }
  return NULL;
}